

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O0

BasicStringView<char> __thiscall
Corrade::Containers::BasicStringView<char>::findLastOr
          (BasicStringView<char> *this,StringView substring,char *fail)

{
  size_t substringSize_00;
  size_t size;
  char *pcVar1;
  char *found;
  size_t substringSize;
  char *fail_local;
  BasicStringView<char> *this_local;
  StringView substring_local;
  
  substring_local._data = (char *)substring._sizePlusFlags;
  this_local = (BasicStringView<char> *)substring._data;
  substringSize_00 = BasicStringView<const_char>::size((BasicStringView<const_char> *)&this_local);
  pcVar1 = this->_data;
  size = BasicStringView<char>::size(this);
  pcVar1 = Implementation::stringFindLastString(pcVar1,size,(char *)this_local,substringSize_00);
  if (pcVar1 == (char *)0x0) {
    BasicStringView((BasicStringView<char> *)&substring_local._sizePlusFlags,fail,0,(nullptr_t)0x0);
  }
  else {
    join_0x00000010_0x00000000_ = slice(this,pcVar1,pcVar1 + substringSize_00);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

inline BasicStringView<T> BasicStringView<T>::findLastOr(const StringView substring, T* const fail) const {
    /* Cache the getters to speed up debug builds */
    const std::size_t substringSize = substring.size();
    if(const char* const found = Implementation::stringFindLastString(_data, size(), substring._data, substringSize))
        return slice(const_cast<T*>(found), const_cast<T*>(found + substringSize));

    /* Using an internal assert-less constructor, the public constructor
       asserts would be redundant. Since it's a zero-sized view, it doesn't
       really make sense to try to preserve any flags. */
    return BasicStringView<T>{fail, 0 /* empty, no flags */, nullptr};
}